

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

AncillaryTextHeader * __thiscall
lrit::HeaderReader<lrit::AncillaryTextHeader>::getHeader
          (HeaderReader<lrit::AncillaryTextHeader> *this)

{
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  HeaderReader<lrit::AncillaryTextHeader> *in_RSI;
  AncillaryTextHeader *in_RDI;
  AncillaryTextHeader *this_00;
  
  this_00 = in_RDI;
  read(in_RSI,(int)in_RSI + 0x10,in_RDX,in_RCX);
  read(in_RSI,(int)in_RSI + 0x12,__buf,in_RCX);
  AncillaryTextHeader::AncillaryTextHeader(this_00,(AncillaryTextHeader *)in_RSI);
  return in_RDI;
}

Assistant:

H getHeader() {
    read(&h_.headerType);
    read(&h_.headerLength);
    return h_;
  }